

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O3

ASTNode * ParseIf(Scope *scope,Lexer *lexer)

{
  Token tok;
  int iVar1;
  ASTNode *pAVar2;
  char *pcVar3;
  ASTNode *pAVar4;
  
  iVar1 = scope->nodeSpot;
  scope->nodeSpot = iVar1 + 1;
  if (iVar1 < scope->nodeLength) {
    pAVar4 = scope->nodes + iVar1;
  }
  else {
    pAVar4 = (ASTNode *)0x0;
  }
  pAVar4->isStmt = true;
  pAVar4->type = IF;
  tok = GetNextToken(lexer);
  if (tok == LPAREN) {
    pAVar2 = ParseExpression(scope,lexer);
    (pAVar4->meta).binaryExpr.left = pAVar2;
    iVar1 = ParseBody(scope,lexer);
    (pAVar4->meta).ifExpr.body = iVar1;
    return pAVar4;
  }
  pcVar3 = TokenToString(tok);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar3,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTNode* ParseIf(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("If");
	TRACK();
	ASTNode* ifExpr = GetNextNode(scope);
	SET_IS_STMT(ifExpr);
	SET_NODE_TYPE(ifExpr, IF);

	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	SET_IF_CONDITION(ifExpr, ParseExpression(scope, lexer));
	SET_IF_BODY(ifExpr, ParseBody(scope, lexer));
	return ifExpr;
}